

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O2

ktx_error_code_e ktxFileStream_getsize(ktxStream *str,ktx_size_t *size)

{
  int iVar1;
  ktx_error_code_e kVar2;
  int *piVar3;
  stat statbuf;
  
  if (size == (ktx_size_t *)0x0 || str == (ktxStream *)0x0) {
    kVar2 = KTX_INVALID_VALUE;
  }
  else {
    if (str->type != eStreamTypeFile) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x134,"ktx_error_code_e ktxFileStream_getsize(ktxStream *, ktx_size_t *)");
    }
    fflush((FILE *)(str->data).file);
    iVar1 = fileno((FILE *)(str->data).file);
    iVar1 = fstat(iVar1,(stat *)&statbuf);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      kVar2 = *piVar3 == 0x4b ^ KTX_FILE_READ_ERROR;
    }
    else {
      kVar2 = KTX_FILE_ISPIPE;
      if (((short)(statbuf.st_mode & 0xf000) != 0x1000) && ((statbuf.st_mode & 0xf000) != 0xc000)) {
        if ((statbuf.st_mode >> 0xd & 1) == 0) {
          *size = statbuf.st_size;
          kVar2 = KTX_SUCCESS;
        }
        else {
          kVar2 = KTX_INVALID_OPERATION;
        }
      }
    }
  }
  return kVar2;
}

Assistant:

static
KTX_error_code ktxFileStream_getsize(ktxStream* str, ktx_size_t* size)
{
    struct stat statbuf;
    int statret;

    if (!str || !size)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    // Need to flush so that fstat will return the current size.
    // Can ignore return value. The only error that can happen is to tell you
    // it was a NOP because the file is read only.
#if (defined(_MSC_VER) && _MSC_VER < 1900) || defined(__MINGW64__) && !defined(_UCRT)
    // Bug in VS2013 msvcrt. fflush on FILE open for READ changes file offset
    // to 4096.
    if (str->data.file->_flag & _IOWRT)
        (void)fflush(str->data.file);
#else
    (void)fflush(str->data.file);
#endif
    statret = fstat(fileno(str->data.file), &statbuf);
    if (statret < 0) {
        switch (errno) {
          case EOVERFLOW: return KTX_FILE_OVERFLOW;
          case EIO:
          default:
            return KTX_FILE_READ_ERROR;
        }
    }

    mode_t ftype = statbuf.st_mode & S_IFMT;
    if (ftype == S_IFIFO || ftype == S_IFSOCK)
        return KTX_FILE_ISPIPE;

    if (statbuf.st_mode & S_IFCHR)
        return KTX_INVALID_OPERATION;

    *size = (ktx_size_t)statbuf.st_size; /* See _getpos for why this cast. */

    return KTX_SUCCESS;
}